

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesrecv.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  Type t;
  Options opts;
  Demodulator demod;
  Monitor monitor;
  Config config;
  sigaction sa;
  Decoder local_3c0;
  shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_> local_3a0;
  Options local_390;
  Demodulator local_360;
  Monitor local_2b8;
  Config local_208;
  sigaction local_a0;
  
  parseOptions(&local_390,argc,argv);
  Config::load(&local_208,&local_390.config);
  iVar1 = std::__cxx11::string::compare((char *)&local_208);
  if (iVar1 == 0) {
    t = LRIT;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_208);
    t = HRIT;
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid downlink type: ",0x17);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_208.demodulator.downlinkType._M_dataplus._M_p,
                          local_208.demodulator.downlinkType._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  Demodulator::Demodulator(&local_360,t);
  Demodulator::initialize(&local_360,&local_208);
  local_3a0.
  super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_360.softBitsQueue_.
            super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_3a0.
  super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_360.softBitsQueue_.
       super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_360.softBitsQueue_.
      super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_360.softBitsQueue_.
       super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_360.softBitsQueue_.
            super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_360.softBitsQueue_.
       super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_360.softBitsQueue_.
            super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Decoder::Decoder(&local_3c0,&local_3a0);
  if (local_3a0.
      super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a0.
               super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Decoder::initialize(&local_3c0,&local_208);
  Monitor::Monitor(&local_2b8,local_390.verbose,local_390.interval);
  Monitor::initialize(&local_2b8,&local_208);
  local_a0.__sigaction_handler.sa_handler = signalHandler;
  sigemptyset(&local_a0.sa_mask);
  local_a0.sa_flags = 0;
  sigaction(2,&local_a0,(sigaction *)0x0);
  sigaction(0xf,&local_a0,(sigaction *)0x0);
  Demodulator::start(&local_360);
  Decoder::start(&local_3c0);
  Monitor::start(&local_2b8);
  while (sigint == '\0') {
    pause();
  }
  Demodulator::stop(&local_360);
  Decoder::stop(&local_3c0);
  Monitor::stop(&local_2b8);
  Monitor::~Monitor(&local_2b8);
  if (local_3c0.thread_._M_id._M_thread == 0) {
    if (local_3c0.statsPublisher_._M_t.
        super___uniq_ptr_impl<StatsPublisher,_std::default_delete<StatsPublisher>_>._M_t.
        super__Tuple_impl<0UL,_StatsPublisher_*,_std::default_delete<StatsPublisher>_>.
        super__Head_base<0UL,_StatsPublisher_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<StatsPublisher,_std::default_delete<StatsPublisher>_>)0x0) {
      (**(code **)(*(long *)local_3c0.statsPublisher_._M_t.
                            super___uniq_ptr_impl<StatsPublisher,_std::default_delete<StatsPublisher>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_StatsPublisher_*,_std::default_delete<StatsPublisher>_>
                            .super__Head_base<0UL,_StatsPublisher_*,_false>._M_head_impl + 8))();
    }
    local_3c0.statsPublisher_._M_t.
    super___uniq_ptr_impl<StatsPublisher,_std::default_delete<StatsPublisher>_>._M_t.
    super__Tuple_impl<0UL,_StatsPublisher_*,_std::default_delete<StatsPublisher>_>.
    super__Head_base<0UL,_StatsPublisher_*,_false>._M_head_impl =
         (__uniq_ptr_data<StatsPublisher,_std::default_delete<StatsPublisher>,_true,_true>)
         (__uniq_ptr_impl<StatsPublisher,_std::default_delete<StatsPublisher>_>)0x0;
    if (local_3c0.packetPublisher_._M_t.
        super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>._M_t.
        super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>.
        super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>)0x0) {
      (*((Publisher *)
        local_3c0.packetPublisher_._M_t.
        super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>._M_t.
        super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>.
        super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl)->_vptr_Publisher[1])();
    }
    local_3c0.packetPublisher_._M_t.
    super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>._M_t.
    super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>.
    super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl =
         (__uniq_ptr_data<PacketPublisher,_std::default_delete<PacketPublisher>,_true,_true>)
         (__uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>)0x0;
    if ((tuple<decoder::Packetizer_*,_std::default_delete<decoder::Packetizer>_>)
        local_3c0.packetizer_._M_t.
        super___uniq_ptr_impl<decoder::Packetizer,_std::default_delete<decoder::Packetizer>_>._M_t.
        super__Tuple_impl<0UL,_decoder::Packetizer_*,_std::default_delete<decoder::Packetizer>_>.
        super__Head_base<0UL,_decoder::Packetizer_*,_false>._M_head_impl !=
        (_Head_base<0UL,_decoder::Packetizer_*,_false>)0x0) {
      std::default_delete<decoder::Packetizer>::operator()
                ((default_delete<decoder::Packetizer> *)&local_3c0,
                 (Packetizer *)
                 local_3c0.packetizer_._M_t.
                 super___uniq_ptr_impl<decoder::Packetizer,_std::default_delete<decoder::Packetizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_decoder::Packetizer_*,_std::default_delete<decoder::Packetizer>_>
                 .super__Head_base<0UL,_decoder::Packetizer_*,_false>._M_head_impl);
    }
    Demodulator::~Demodulator(&local_360);
    Config::~Config(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.config._M_dataplus._M_p != &local_390.config.field_2) {
      operator_delete(local_390.config._M_dataplus._M_p,
                      local_390.config.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);

  // Convert string option to enum
  Demodulator::Type downlinkType;
  if (config.demodulator.downlinkType == "lrit") {
    downlinkType = Demodulator::LRIT;
  } else if (config.demodulator.downlinkType == "hrit") {
    downlinkType = Demodulator::HRIT;
  } else {
    std::cerr
      << "Invalid downlink type: "
      << config.demodulator.downlinkType
      << std::endl;
    exit(1);
  }

  Demodulator demod(downlinkType);
  demod.initialize(config);

  Decoder decode(demod.getSoftBitsQueue());
  decode.initialize(config);

  Monitor monitor(opts.verbose, opts.interval);
  monitor.initialize(config);

  // Install signal handler
  struct sigaction sa;
  sa.sa_handler = signalHandler;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(SIGINT, &sa, NULL);
  sigaction(SIGTERM, &sa, NULL);

  demod.start();
  decode.start();
  monitor.start();

  while (!sigint) {
    pause();
  }

  demod.stop();
  decode.stop();
  monitor.stop();

  return 0;
}